

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_l2_norm(ggml_compute_params *params,ggml_tensor *dst)

{
  int *piVar1;
  uint *puVar2;
  float fVar3;
  float fVar4;
  ggml_tensor *pgVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  void *pvVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  bool bVar30;
  byte bVar31;
  byte bVar32;
  char cVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  char *pcVar37;
  long lVar38;
  long lVar39;
  uint uVar40;
  undefined8 uVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  int np;
  uint uVar46;
  long lVar47;
  long lVar48;
  ushort uVar49;
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  float __x;
  undefined1 auVar57 [16];
  undefined1 extraout_var [60];
  long local_178;
  long local_170;
  long local_168;
  long local_150;
  long local_148;
  long local_140;
  long local_118;
  long local_110;
  
  pgVar5 = dst->src[0];
  if (pgVar5->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0xdf6,"fatal error");
  }
  cVar33 = ggml_are_same_shape(pgVar5);
  if (cVar33 == '\0') {
    pcVar37 = "ggml_are_same_shape(src0, dst)";
    uVar41 = 0xdc4;
  }
  else if (pgVar5->nb[0] == 4) {
    fVar3 = (float)dst->op_params[0];
    if (0.0 <= fVar3) {
      lVar6 = pgVar5->ne[3];
      if (0 < lVar6) {
        lVar42 = (long)params->ith;
        lVar44 = (long)params->nth;
        lVar7 = pgVar5->ne[0];
        lVar8 = pgVar5->ne[1];
        lVar9 = pgVar5->ne[2];
        sVar10 = pgVar5->nb[1];
        sVar11 = pgVar5->nb[2];
        sVar12 = dst->nb[1];
        uVar40 = (uint)lVar7;
        uVar46 = uVar40 & 0xffffffc0;
        lVar34 = (long)(int)uVar46;
        lVar39 = (long)(int)uVar40;
        if ((long)(int)uVar40 < lVar34 + 1) {
          lVar39 = lVar34 + 1;
        }
        auVar50 = vpbroadcastq_avx512f();
        auVar50 = vmovdqu64_avx512f(auVar50);
        local_140 = sVar10 * lVar42;
        local_148 = sVar12 * lVar42;
        local_150 = local_148 + lVar34 * 4;
        sVar13 = pgVar5->nb[3];
        sVar14 = dst->nb[2];
        sVar15 = dst->nb[3];
        local_178 = 0;
        do {
          if (0 < lVar9) {
            local_110 = local_150;
            local_118 = local_148;
            local_168 = local_140;
            local_170 = 0;
            do {
              if (lVar42 < lVar8) {
                lVar43 = local_110;
                lVar45 = local_118;
                lVar47 = local_168;
                lVar48 = lVar42;
                do {
                  if (lVar7 < 1) {
                    __x = 0.0;
                  }
                  else {
                    __x = 0.0;
                    lVar35 = 0;
                    do {
                      fVar4 = *(float *)((long)pgVar5->data + lVar35 * 4 + lVar47);
                      __x = __x + fVar4 * fVar4;
                      lVar35 = lVar35 + 1;
                    } while (lVar7 != lVar35);
                  }
                  pvVar16 = dst->data;
                  memcpy((void *)(lVar48 * sVar12 + local_170 * sVar14 + local_178 * sVar15 +
                                 (long)pvVar16),
                         (void *)((long)pgVar5->data +
                                 lVar48 * sVar10 + local_170 * sVar11 + local_178 * sVar13),
                         lVar7 * 4);
                  if (__x < 0.0) {
                    auVar51._0_4_ = sqrtf(__x);
                    auVar51._4_60_ = extraout_var;
                    auVar57 = auVar51._0_16_;
                  }
                  else {
                    auVar57 = vsqrtss_avx(ZEXT416((uint)__x),ZEXT416((uint)__x));
                  }
                  auVar51 = vmovdqu64_avx512f(auVar50);
                  auVar52 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                  auVar53 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                  auVar29 = vmaxss_avx(ZEXT416((uint)fVar3),auVar57);
                  uVar41 = vcmpss_avx512f(auVar57,auVar57,3);
                  bVar30 = (bool)((byte)uVar41 & 1);
                  auVar57._0_4_ =
                       1.0 / (float)((uint)bVar30 * (int)fVar3 + (uint)!bVar30 * auVar29._0_4_);
                  auVar57._4_12_ = SUB6012((undefined1  [60])0x0,0);
                  auVar54 = vbroadcastss_avx512f(auVar57);
                  if (0 < (int)uVar46) {
                    lVar35 = (long)pvVar16 + lVar45;
                    uVar36 = 0;
                    do {
                      lVar38 = 0;
                      do {
                        auVar55 = vmulps_avx512f(auVar54,*(undefined1 (*) [64])(lVar35 + lVar38));
                        *(undefined1 (*) [64])(lVar35 + lVar38) = auVar55;
                        lVar38 = lVar38 + 0x40;
                      } while (lVar38 != 0x100);
                      uVar36 = uVar36 + 0x40;
                      lVar35 = lVar35 + 0x100;
                    } while (uVar36 < uVar46);
                  }
                  if (uVar46 != uVar40) {
                    uVar36 = 0;
                    do {
                      auVar55 = vpbroadcastq_avx512f();
                      auVar56 = vporq_avx512f(auVar55,auVar52);
                      auVar55 = vporq_avx512f(auVar55,auVar53);
                      uVar41 = vpcmpuq_avx512f(auVar55,auVar51,2);
                      bVar31 = (byte)uVar41;
                      uVar41 = vpcmpuq_avx512f(auVar56,auVar51,2);
                      bVar32 = (byte)uVar41;
                      uVar49 = CONCAT11(bVar32,bVar31);
                      piVar1 = (int *)((long)pvVar16 + uVar36 * 4 + lVar43);
                      auVar55._4_4_ = (uint)((byte)(uVar49 >> 1) & 1) * piVar1[1];
                      auVar55._0_4_ = (uint)(bVar31 & 1) * *piVar1;
                      auVar55._8_4_ = (uint)((byte)(uVar49 >> 2) & 1) * piVar1[2];
                      auVar55._12_4_ = (uint)((byte)(uVar49 >> 3) & 1) * piVar1[3];
                      auVar55._16_4_ = (uint)((byte)(uVar49 >> 4) & 1) * piVar1[4];
                      auVar55._20_4_ = (uint)((byte)(uVar49 >> 5) & 1) * piVar1[5];
                      auVar55._24_4_ = (uint)((byte)(uVar49 >> 6) & 1) * piVar1[6];
                      auVar55._28_4_ = (uint)((byte)(uVar49 >> 7) & 1) * piVar1[7];
                      auVar55._32_4_ = (uint)(bVar32 & 1) * piVar1[8];
                      auVar55._36_4_ = (uint)(bVar32 >> 1 & 1) * piVar1[9];
                      auVar55._40_4_ = (uint)(bVar32 >> 2 & 1) * piVar1[10];
                      auVar55._44_4_ = (uint)(bVar32 >> 3 & 1) * piVar1[0xb];
                      auVar55._48_4_ = (uint)(bVar32 >> 4 & 1) * piVar1[0xc];
                      auVar55._52_4_ = (uint)(bVar32 >> 5 & 1) * piVar1[0xd];
                      auVar55._56_4_ = (uint)(bVar32 >> 6 & 1) * piVar1[0xe];
                      auVar55._60_4_ = (uint)(bVar32 >> 7) * piVar1[0xf];
                      auVar55 = vmulps_avx512f(auVar54,auVar55);
                      puVar2 = (uint *)((long)pvVar16 + uVar36 * 4 + lVar43);
                      bVar30 = (bool)((byte)(uVar49 >> 1) & 1);
                      bVar17 = (bool)((byte)(uVar49 >> 2) & 1);
                      bVar18 = (bool)((byte)(uVar49 >> 3) & 1);
                      bVar19 = (bool)((byte)(uVar49 >> 4) & 1);
                      bVar20 = (bool)((byte)(uVar49 >> 5) & 1);
                      bVar21 = (bool)((byte)(uVar49 >> 6) & 1);
                      bVar22 = (bool)((byte)(uVar49 >> 7) & 1);
                      bVar23 = (bool)(bVar32 >> 1 & 1);
                      bVar24 = (bool)(bVar32 >> 2 & 1);
                      bVar25 = (bool)(bVar32 >> 3 & 1);
                      bVar26 = (bool)(bVar32 >> 4 & 1);
                      bVar27 = (bool)(bVar32 >> 5 & 1);
                      bVar28 = (bool)(bVar32 >> 6 & 1);
                      *puVar2 = (uint)(bVar31 & 1) * auVar55._0_4_ |
                                (uint)!(bool)(bVar31 & 1) * *puVar2;
                      puVar2[1] = (uint)bVar30 * auVar55._4_4_ | (uint)!bVar30 * puVar2[1];
                      puVar2[2] = (uint)bVar17 * auVar55._8_4_ | (uint)!bVar17 * puVar2[2];
                      puVar2[3] = (uint)bVar18 * auVar55._12_4_ | (uint)!bVar18 * puVar2[3];
                      puVar2[4] = (uint)bVar19 * auVar55._16_4_ | (uint)!bVar19 * puVar2[4];
                      puVar2[5] = (uint)bVar20 * auVar55._20_4_ | (uint)!bVar20 * puVar2[5];
                      puVar2[6] = (uint)bVar21 * auVar55._24_4_ | (uint)!bVar21 * puVar2[6];
                      puVar2[7] = (uint)bVar22 * auVar55._28_4_ | (uint)!bVar22 * puVar2[7];
                      puVar2[8] = (uint)(bVar32 & 1) * auVar55._32_4_ |
                                  (uint)!(bool)(bVar32 & 1) * puVar2[8];
                      puVar2[9] = (uint)bVar23 * auVar55._36_4_ | (uint)!bVar23 * puVar2[9];
                      puVar2[10] = (uint)bVar24 * auVar55._40_4_ | (uint)!bVar24 * puVar2[10];
                      puVar2[0xb] = (uint)bVar25 * auVar55._44_4_ | (uint)!bVar25 * puVar2[0xb];
                      puVar2[0xc] = (uint)bVar26 * auVar55._48_4_ | (uint)!bVar26 * puVar2[0xc];
                      puVar2[0xd] = (uint)bVar27 * auVar55._52_4_ | (uint)!bVar27 * puVar2[0xd];
                      puVar2[0xe] = (uint)bVar28 * auVar55._56_4_ | (uint)!bVar28 * puVar2[0xe];
                      puVar2[0xf] = (uint)(bVar32 >> 7) * auVar55._60_4_ |
                                    (uint)!(bool)(bVar32 >> 7) * puVar2[0xf];
                      uVar36 = uVar36 + 0x10;
                    } while (((lVar39 - lVar34) + 0xfU & 0xfffffffffffffff0) != uVar36);
                  }
                  lVar48 = lVar48 + lVar44;
                  lVar47 = lVar47 + sVar10 * lVar44;
                  lVar45 = lVar45 + sVar12 * lVar44;
                  lVar43 = lVar43 + sVar12 * lVar44;
                } while (lVar48 < lVar8);
              }
              local_170 = local_170 + 1;
              local_168 = local_168 + sVar11;
              local_118 = local_118 + sVar14;
              local_110 = local_110 + sVar14;
            } while (local_170 != lVar9);
          }
          local_178 = local_178 + 1;
          local_140 = local_140 + sVar13;
          local_148 = local_148 + sVar15;
          local_150 = local_150 + sVar15;
        } while (local_178 != lVar6);
      }
      return;
    }
    pcVar37 = "eps >= 0.0f";
    uVar41 = 0xdd0;
  }
  else {
    pcVar37 = "src0->nb[0] == sizeof(float)";
    uVar41 = 0xdc6;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar41,"GGML_ASSERT(%s) failed",pcVar37);
}

Assistant:

void ggml_compute_forward_l2_norm(
    const ggml_compute_params * params,
    ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_l2_norm_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}